

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O1

oonf_subsystem * oonf_subsystem_load(char *libname)

{
  avl_node *paVar1;
  void *pvVar2;
  undefined8 uVar3;
  oonf_subsystem *poVar4;
  undefined4 uVar5;
  long lVar6;
  
  paVar1 = avl_find(&oonf_plugin_tree,libname);
  poVar4 = (oonf_subsystem *)(paVar1 + -2);
  if (paVar1 == (avl_node *)0x0) {
    lVar6 = 0;
    do {
      pvVar2 = _open_plugin_template(libname,(int)lVar6,1);
      if (pvVar2 != (void *)0x0) goto LAB_0014e359;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = 3;
    if ((log_global_mask[4] & 4) == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = (void *)0x0;
      oonf_log(LOG_SEVERITY_WARN,LOG_PLUGINS,"src/libcore/oonf_subsystem.c",0x21d,(void *)0x0,0,
               "Loading of plugin %s failed.\n",libname);
    }
LAB_0014e359:
    if (pvVar2 != (void *)0x0) {
      paVar1 = avl_find(&oonf_plugin_tree,libname);
      if (paVar1 != (avl_node *)0x0) {
        paVar1[-1].key = pvVar2;
        uVar5 = (undefined4)lVar6;
        paVar1[-1].balance = (char)uVar5;
        paVar1[-1].follower = (_Bool)(char)((uint)uVar5 >> 8);
        *(short *)&paVar1[-1].field_0x32 = (short)((uint)uVar5 >> 0x10);
        return (oonf_subsystem *)(paVar1 + -2);
      }
      if ((log_global_mask[4] & 4) != 0) {
        uVar3 = dlerror();
        oonf_log(LOG_SEVERITY_WARN,LOG_PLUGINS,"src/libcore/oonf_subsystem.c",0x138,(void *)0x0,0,
                 "dynamic library loading failed: \"%s\"!\n",uVar3);
      }
      dlclose(pvVar2);
    }
    poVar4 = (oonf_subsystem *)0x0;
  }
  return poVar4;
}

Assistant:

struct oonf_subsystem *
oonf_subsystem_load(const char *libname) {
  struct oonf_subsystem *plugin;
  void *dlhandle;
  int idx;

  /* see if the plugin is there */
  if ((plugin = oonf_subsystem_get(libname)) == NULL) {
    /* attempt to load the plugin */
    dlhandle = _open_plugin(libname, &idx);

    if (dlhandle == NULL) {
      /* Logging output has already been done by _open_plugin() */
      return NULL;
    }

    /* plugin should be in the tree now */
    if ((plugin = oonf_subsystem_get(libname)) == NULL) {
      OONF_WARN(LOG_PLUGINS, "dynamic library loading failed: \"%s\"!\n", dlerror());
      dlclose(dlhandle);
      return NULL;
    }

    plugin->_dlhandle = dlhandle;
    plugin->_dlpath_index = idx;
  }
  return plugin;
}